

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O1

EStatusCode __thiscall
ShadingWriter::WriteLinearShadingPatternObject
          (ShadingWriter *this,double inX0,double inY0,double inX1,double inY1,
          InterpretedGradientStopList *inColorLine,FT_PaintExtend inGradientExtend,
          PDFRectangle *inBounds,PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  EStatusCode EVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  LinearShading linearParams;
  LinearShading local_70;
  
  local_70.x0 = inX0;
  local_70.y0 = inY0;
  local_70.x1 = inX1;
  local_70.y1 = inY1;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
            (&local_70.colorLine,inColorLine);
  p_Var2 = (inColorLine->
           super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  local_70.gradientExtend = inGradientExtend;
  if (p_Var2 != (_List_node_base *)inColorLine) {
    do {
      if (((double)p_Var2[1]._M_prev != 1.0) || (NAN((double)p_Var2[1]._M_prev))) {
        bVar3 = false;
      }
      else {
        bVar3 = *(char *)((long)(p_Var2 + 1 + 1) + 3) == -1;
      }
    } while ((bVar3) &&
            (p_Var2 = (((_List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>
                         *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var2 != (_List_node_base *)inColorLine));
    if (!bVar3) {
      EVar1 = WriteRGBATiledPatternObject(this,&local_70,inBounds,inMatrix,inPatternObjectId);
      goto joined_r0x001e888d;
    }
  }
  EVar1 = WriteRGBShadingPatternObject(this,&local_70,inBounds,inMatrix,inPatternObjectId);
joined_r0x001e888d:
  while (local_70.colorLine.
         super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl
         ._M_node.super__List_node_base._M_next != (_List_node_base *)&local_70.colorLine) {
    p_Var2 = (local_70.colorLine.
              super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>.
              _M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_70.colorLine.
                    super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>
                    ._M_impl._M_node.super__List_node_base._M_next,0x28);
    local_70.colorLine.
    super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
    _M_node.super__List_node_base._M_next = p_Var2;
  }
  return EVar1;
}

Assistant:

EStatusCode ShadingWriter::WriteLinearShadingPatternObject(
    double inX0,
    double inY0,
    double inX1,
    double inY1,
    const InterpretedGradientStopList& inColorLine,
    FT_PaintExtend inGradientExtend,
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId
) {
    LinearShading linearParams = {
        inX0,
        inY0,
        inX1,
        inY1,
        inColorLine,
        inGradientExtend
    };

    if(ColorLineHasTransparency(inColorLine))
        return WriteRGBATiledPatternObject(linearParams, inBounds, inMatrix, inPatternObjectId);
    else
        return WriteRGBShadingPatternObject(linearParams, inBounds, inMatrix, inPatternObjectId);

}